

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removedCol(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,int i)

{
  Representation RVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  Status *pSVar3;
  SPxId *pSVar4;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  uint uVar6;
  SPxId id;
  SPxColId local_38;
  
  RVar1 = this->theLP->theRep;
  if (RVar1 == COLUMN) {
    if ((this->thedesc).colstat.data[i] < D_FREE) goto LAB_002f6681;
  }
  else {
    this->factorized = false;
    if (0 < RVar1 * (this->thedesc).colstat.data[i]) {
      if (NO_PROBLEM < this->thestatus) {
        for (uVar6 = (this->theLP->thecovectors->set).thenum; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
          id.super_DataKey = (this->theBaseId).data[uVar6].super_DataKey;
          if ((0 < id.super_DataKey.info) &&
             (pSVar2 = this->theLP, SPxColId::SPxColId(&local_38,&id),
             (pSVar2->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem[local_38.super_DataKey.idx].info < 0)) {
            pSVar4 = (this->theBaseId).data;
            pSVar4[uVar6].super_DataKey =
                 pSVar4[(this->theLP->thecovectors->set).thenum].super_DataKey;
            if ((this->matrixIsSetup == true) &&
               ((int)uVar6 < (this->theLP->thecovectors->set).thenum)) {
              pSVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::vector(this->theLP,(this->theBaseId).data + uVar6);
              (this->matrix).data[uVar6] = pSVar5;
            }
            break;
          }
        }
      }
      goto LAB_002f6681;
    }
  }
  setStatus(this,NO_PROBLEM);
LAB_002f6681:
  pSVar3 = (this->thedesc).colstat.data;
  pSVar3[i] = pSVar3[(this->theLP->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum];
  reDim(this);
  return;
}

Assistant:

void SPxBasisBase<R>::removedCol(int i)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);

   if(theLP->rep() == SPxSolverBase<R>::COLUMN)
   {
      if(theLP->isBasic(thedesc.colStatus(i)))
         setStatus(NO_PROBLEM);
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::ROW);
      factorized = false;

      if(!theLP->isBasic(thedesc.colStatus(i)))
         setStatus(NO_PROBLEM);
      else if(status() > NO_PROBLEM)
      {
         for(int j = theLP->dim(); j >= 0; --j)
         {
            SPxId id = baseId(j);

            if(id.isSPxColId() && !theLP->has(SPxColId(id)))
            {
               baseId(j) = baseId(theLP->dim());

               if(matrixIsSetup &&
                     j < theLP->dim())
                  matrix[j] = &theLP->vector(baseId(j));

               break;
            }
         }
      }
   }

   thedesc.colStatus(i) = thedesc.colStatus(theLP->nCols());
   reDim();
}